

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvagetbios.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  char *__s1;
  char *pcVar5;
  int cnum;
  int length;
  uint8_t vbios [1048576];
  int in_stack_ffffffffffefffbc;
  
  iVar2 = nva_init();
  if (iVar2 == 0) {
    pcVar1 = (char *)0x0;
    do {
      while( true ) {
        while (__s1 = pcVar1, pcVar5 = (char *)(ulong)(uint)argc, iVar2 = getopt(argc,argv,"hc:s:"),
              pcVar1 = __s1, 0x67 < iVar2) {
          pcVar1 = _optarg;
          if ((iVar2 != 0x73) && (pcVar1 = __s1, iVar2 == 0x68)) {
            main_cold_2();
            goto LAB_00101890;
          }
        }
        if (iVar2 != 99) break;
        __isoc99_sscanf(_optarg,"%d",&stack0xffffffffffefffb8);
      }
    } while (iVar2 != -1);
    if (0 < nva_cardsnum) {
      if (__s1 == (char *)0x0) {
        __s1 = "PRAMIN";
        if (nva_cards->chipset < 4) {
          __s1 = "PROM";
        }
        fprintf(_stderr,
                "No extraction method specified (using -s extraction_method). Defaulting to %s.\n",
                __s1);
      }
      iVar2 = strcasecmp(__s1,"pramin");
      if (iVar2 == 0) {
        iVar2 = vbios_extract_pramin(0,&stack0xffffffffffefffc8,(int *)&stack0xffffffffffefffbc);
      }
      else {
        iVar2 = strcasecmp(__s1,"prom");
        pcVar5 = __s1;
        if (iVar2 != 0) {
LAB_00101890:
          main_cold_5();
          if ((*pcVar5 == 'U') && (pcVar5[1] == -0x56)) {
            uVar4 = (ulong)*(ushort *)(pcVar5 + 0x18);
            if ((((pcVar5[uVar4] == 'P') && (pcVar5[uVar4 + 1] == 'C')) &&
                (pcVar5[uVar4 + 2] == 'I')) && (pcVar5[uVar4 + 3] == 'R')) {
              return 1;
            }
            nv_checksignature_cold_2();
          }
          else {
            nv_checksignature_cold_1();
          }
          return -2;
        }
        iVar2 = vbios_extract_prom(0,&stack0xffffffffffefffc8,(int *)&stack0xffffffffffefffbc);
      }
      iVar3 = fileno(_stdout);
      iVar3 = isatty(iVar3);
      if (iVar3 == 0) {
        fwrite(&stack0xffffffffffefffc8,1,(long)in_stack_ffffffffffefffbc,_stdout);
      }
      else {
        main_cold_6();
      }
      return (uint)(iVar2 != 1);
    }
    if (nva_cardsnum == 0) {
      main_cold_4();
    }
    else {
      main_cold_3();
    }
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	uint8_t vbios[NV_PROM_SIZE];
	int c;
	int cnum =0;
	char const *source = NULL;
	int result = 0;
	int length;

	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}

	/* Arguments parsing */
	while ((c = getopt (argc, argv, "hc:s:")) != -1) {
		switch (c) {
			case 'h':
				usage(0);
				break;
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
			case 's':
				source = optarg;
				break;
		}
	}

	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	if (source == NULL) {
		if (nva_cards[cnum].chipset < 4)
			source = "PROM";
		else
			source = "PRAMIN";
		fprintf(stderr, "No extraction method specified (using -s extraction_method). Defaulting to %s.\n", source);
	}

	/* Extraction */
	if (strcasecmp(source, "pramin") == 0)
		result = vbios_extract_pramin(cnum, vbios, &length);
	else if (strcasecmp(source, "prom") == 0)
		result = vbios_extract_prom(cnum, vbios, &length);
	else {
		fprintf(stderr, "Unknown vbios extraction method.\n");
		usage(1);
	}

	if (isatty(fileno(stdout))) {
		fprintf(stderr, "Refusing to write BIOS image to a terminal - please redirect output to a file.\n");
	} else {
		/* print the vbios on stdout */
		fwrite(vbios, 1, length, stdout);
	}

	return result != EOK;
}